

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkdiskcache.cpp
# Opt level: O0

void QNetworkDiskCache::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  QNetworkDiskCache *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    (**(code **)(*in_RDI + 0x98))();
  }
  return;
}

Assistant:

void QNetworkDiskCache::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkDiskCache *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->clear(); break;
        default: ;
        }
    }
    (void)_a;
}